

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QTable.cpp
# Opt level: O1

void QTable::Load(string *filename,size_t nrRows,size_t nrColumns,size_t nrTables,QTables *Qs)

{
  pointer pQVar1;
  pointer pQVar2;
  char cVar3;
  ostream *poVar4;
  istream *piVar5;
  undefined8 *puVar6;
  pointer pQVar7;
  size_t sVar8;
  size_t sVar9;
  bool bVar10;
  string buffer;
  double q;
  QTable Q;
  ifstream fp;
  istringstream is;
  size_t local_428;
  undefined1 *local_410;
  undefined8 local_408;
  undefined1 local_400;
  undefined7 uStack_3ff;
  double local_3f0;
  QTable local_3e8;
  long local_3b8 [4];
  byte abStack_398 [488];
  istringstream local_1b0 [120];
  ios_base local_138 [264];
  
  std::ifstream::ifstream(local_3b8,(filename->_M_dataplus)._M_p,_S_in);
  if ((abStack_398[*(long *)(local_3b8[0] + -0x18)] & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"QTable::Load: failed to ",0x18);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"open file ",10);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(filename->_M_dataplus)._M_p,
                        filename->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
  }
  QTable(&local_3e8,nrRows,nrColumns);
  pQVar1 = (Qs->super__Vector_base<QTable,_std::allocator<QTable>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  pQVar2 = (Qs->super__Vector_base<QTable,_std::allocator<QTable>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
  pQVar7 = pQVar1;
  if (pQVar2 != pQVar1) {
    do {
      (*(pQVar7->super_QTableInterface)._vptr_QTableInterface[2])(pQVar7);
      pQVar7 = pQVar7 + 1;
    } while (pQVar7 != pQVar2);
    (Qs->super__Vector_base<QTable,_std::allocator<QTable>_>)._M_impl.super__Vector_impl_data.
    _M_finish = pQVar1;
  }
  if (nrTables != 0) {
    sVar9 = nrTables;
    do {
      std::vector<QTable,_std::allocator<QTable>_>::push_back(Qs,&local_3e8);
      sVar9 = sVar9 - 1;
    } while (sVar9 != 0);
  }
  local_410 = &local_400;
  local_408 = 0;
  local_400 = 0;
  sVar9 = 0;
  local_428 = 0;
  while( true ) {
    cVar3 = std::ios::widen((char)*(undefined8 *)(local_3b8[0] + -0x18) + (char)(istream *)local_3b8
                           );
    piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_3b8,(string *)&local_410,cVar3);
    if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 2) != 0) {
      if (local_428 != nrTables) {
        puVar6 = (undefined8 *)__cxa_allocate_exception(0x28);
        *puVar6 = &PTR__E_0059bd80;
        puVar6[1] = puVar6 + 3;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(puVar6 + 1),"QTable::Load wrong number of tables","");
        __cxa_throw(puVar6,&E::typeinfo,E::~E);
      }
      if (local_410 != &local_400) {
        operator_delete(local_410,CONCAT71(uStack_3ff,local_400) + 1);
      }
      if (local_3e8.super_matrix_t.data_.size_ != 0) {
        operator_delete(local_3e8.super_matrix_t.data_.data_,
                        local_3e8.super_matrix_t.data_.size_ << 3);
      }
      std::ifstream::~ifstream(local_3b8);
      return;
    }
    std::__cxx11::istringstream::istringstream(local_1b0,(string *)&local_410,_S_in);
    sVar8 = 0;
    while (piVar5 = std::istream::_M_extract<double>((double *)local_1b0),
          ((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) == 0) {
      pQVar1 = (Qs->super__Vector_base<QTable,_std::allocator<QTable>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pQVar1[local_428].super_matrix_t.data_.data_
      [pQVar1[local_428].super_matrix_t.size2_ * sVar9 + sVar8] = local_3f0;
      sVar8 = sVar8 + 1;
    }
    if (nrColumns != sVar8) break;
    sVar9 = sVar9 + 1;
    bVar10 = sVar9 == nrRows;
    if (bVar10) {
      sVar9 = 0;
    }
    local_428 = local_428 + bVar10;
    std::__cxx11::istringstream::~istringstream(local_1b0);
    std::ios_base::~ios_base(local_138);
  }
  puVar6 = (undefined8 *)__cxa_allocate_exception(0x28);
  *puVar6 = &PTR__E_0059bd80;
  puVar6[1] = puVar6 + 3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(puVar6 + 1),"QTable::Load wrong number of columns","");
  __cxa_throw(puVar6,&E::typeinfo,E::~E);
}

Assistant:

void QTable::Load(const std::string &filename,
                  size_t nrRows,
                  size_t nrColumns,
                  size_t nrTables,
                  QTables &Qs)
{
    ifstream fp(filename.c_str());
    if(!fp)
    {
        cerr << "QTable::Load: failed to "
             << "open file " << filename << endl;            
    }

    size_t a,s,i;
    double q;

    QTable Q(nrRows,nrColumns);
//    QTables Qs;
    Qs.clear();
    for(i=0;i!=nrTables;i++)
        Qs.push_back(Q);
    
    s=0;
    i=0;
    string buffer;
    while(!getline(fp,buffer).eof())
    {
        istringstream is(buffer);
        a=0;
        while(is >> q)
            Qs[i](s,a++)=q;

        if(a!=nrColumns)
            throw(E("QTable::Load wrong number of columns"));

        s++;
        if(s==nrRows)
        {
            i++;
            s=0;
        }
    }
    
    if(i!=nrTables)
        throw(E("QTable::Load wrong number of tables"));
}